

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

pqpair tnonc_s2pq(double t,double df,double delta)

{
  bool bVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  ulong in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ulong in_XMM2_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  pqpair pVar22;
  double xx;
  double q;
  double p;
  double local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  double local_138;
  double dStack_130;
  undefined1 local_128 [16];
  double local_118;
  ulong uStack_110;
  double local_100;
  undefined1 local_f8 [16];
  double local_e8;
  double dStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  ulong uStack_80;
  undefined1 local_78 [16];
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  ulong uStack_30;
  double local_20;
  double local_18;
  
  local_148._8_8_ = local_148._0_8_;
  dVar17 = 0.0;
  if (df <= 0.0) {
    dVar20 = 1.0;
  }
  else {
    local_38 = ABS(delta);
    uStack_30 = in_XMM2_Qb & 0x7fffffffffffffff;
    if (1e-08 <= local_38) {
      local_128._8_4_ = in_XMM1_Dc;
      local_128._0_8_ = df;
      local_128._12_4_ = in_XMM1_Dd;
      local_98 = (double)(-(ulong)(0.0 <= t) & (ulong)delta | ~-(ulong)(0.0 <= t) & (ulong)-delta);
      dStack_90 = (double)(in_XMM0_Qb & in_XMM2_Qb | ~in_XMM0_Qb & (in_XMM2_Qb ^ 0x8000000000000000)
                          );
      local_160 = -local_98;
      local_88 = t;
      uStack_80 = in_XMM0_Qb;
      cumnor(&local_160,&local_18,&local_20);
      if ((local_88 != 0.0) || (NAN(local_88))) {
        local_c0 = local_18;
        uVar13 = (undefined4)((ulong)-local_88 >> 0x20);
        uStack_110 = uStack_80 ^ 0x8000000000000000;
        if (-local_88 <= local_88) {
          uVar13 = (undefined4)((ulong)local_88 >> 0x20);
        }
        local_138 = (double)(~-(ulong)((double)local_128._0_8_ == 1.0) & local_128._0_8_ |
                            -(ulong)((double)local_128._0_8_ == 1.0) & 0x3ff000001ad7f29b);
        local_118 = (double)CONCAT44(uVar13,SUB84(local_88,0)) *
                    (double)CONCAT44(uVar13,SUB84(local_88,0));
        local_e8 = local_98 * 0.5 * local_98;
        dStack_e0 = dStack_90;
        local_118 = local_118 / (local_118 + local_138);
        local_158._0_8_ = (undefined8)(int)local_e8;
        local_158._8_8_ = (undefined8)(int)dStack_90;
        local_128._8_8_ = (double)local_158._0_8_ + 0.5;
        local_128._0_8_ = (double)local_158._0_8_ + 1.0;
        local_138 = local_138 * 0.5;
        dStack_130 = 0.0;
        dVar17 = log(local_e8);
        local_f8._0_8_ = dVar17 * (double)local_158._0_8_ - local_e8;
        local_160 = (double)local_128._0_8_;
        dVar17 = alngam(&local_160);
        local_f8._0_8_ = exp((double)local_f8._0_8_ - dVar17);
        local_f8._8_8_ = extraout_XMM0_Qb;
        dVar17 = log(local_e8);
        local_158._0_8_ = dVar17 * (double)local_158._0_8_ - local_e8;
        local_160 = (double)local_128._0_8_ + 0.5;
        dVar17 = alngam(&local_160);
        local_58 = exp((double)local_158._0_8_ - dVar17);
        local_158._8_4_ = local_128._8_4_;
        local_158._0_8_ = local_128._8_8_;
        local_158._12_4_ = local_128._12_4_;
        local_68 = betadf(local_118,local_128._8_8_,local_138);
        local_48 = betadf(local_118,(double)local_128._0_8_,local_138);
        local_160 = local_138 + (double)local_158._0_8_;
        local_a8 = local_160 + -1.0;
        local_d8 = (double)local_158._0_8_ + -1.0;
        uStack_d0 = local_158._8_8_;
        local_100 = 1.0 - local_118;
        local_78._8_4_ = SUB84(dStack_130,0);
        local_78._0_8_ = local_160;
        local_78._12_4_ = (int)((ulong)dStack_130 >> 0x20);
        uStack_a0 = dStack_130;
        if (local_a8 <= 0.0) {
          local_148._0_8_ = alngam(&local_160);
          local_160 = (double)local_158._0_8_;
          dVar17 = alngam(&local_160);
          local_148._0_8_ = (double)local_148._0_8_ - dVar17;
          local_160 = local_138;
          dVar17 = alngam(&local_160);
          local_148._0_8_ = (double)local_148._0_8_ - dVar17;
          dVar17 = log(local_118);
          local_158._0_8_ = dVar17 * local_d8 + (double)local_148._0_8_;
          dVar17 = log(local_100);
          local_b8 = exp(dVar17 * local_138 + (double)local_158._0_8_);
          local_b8 = local_b8 / local_a8;
        }
        else {
          local_160 = local_a8;
          local_148._0_8_ = alngam(&local_160);
          local_160 = (double)local_158._0_8_;
          dVar17 = alngam(&local_160);
          local_148._0_8_ = (double)local_148._0_8_ - dVar17;
          local_160 = local_138;
          dVar17 = alngam(&local_160);
          local_148._0_8_ = (double)local_148._0_8_ - dVar17;
          dVar17 = log(local_118);
          local_158._0_8_ = dVar17 * local_d8 + (double)local_148._0_8_;
          dVar17 = log(local_100);
          local_b8 = exp(dVar17 * local_138 + (double)local_158._0_8_);
        }
        iVar10 = (int)local_e8;
        local_d8 = local_138 + (double)local_128._0_8_;
        uStack_d0 = dStack_130;
        local_160 = local_d8 + -1.0;
        local_148._8_4_ = SUB84(dStack_130,0);
        local_148._0_8_ = local_160;
        local_148._12_4_ = (int)((ulong)dStack_130 >> 0x20);
        dVar17 = alngam(&local_160);
        local_160 = (double)local_128._0_8_;
        local_158._0_8_ = dVar17;
        dVar17 = alngam(&local_160);
        local_158._0_8_ = (double)local_158._0_8_ - dVar17;
        local_160 = local_138;
        dVar17 = alngam(&local_160);
        local_158._0_8_ = (double)local_158._0_8_ - dVar17;
        local_c8 = (double)local_128._0_8_ + -1.0;
        dVar17 = log(local_118);
        local_158._0_8_ = dVar17 * local_c8 + (double)local_158._0_8_;
        dVar17 = log(local_100);
        auVar12._0_8_ = exp(dVar17 * local_138 + (double)local_158._0_8_);
        auVar12._8_8_ = local_b8;
        auVar14._0_8_ = (double)local_148._0_8_ * local_118 * auVar12._0_8_;
        auVar14._8_8_ = local_a8 * local_118 * local_b8;
        local_148 = divpd(auVar14,local_128);
        local_98 = local_98 / 1.4142135623731;
        dVar17 = 1.0 - (double)local_f8._0_8_;
        dVar20 = local_68 * (double)local_f8._0_8_ + local_58 * local_98 * local_48;
        auVar16._8_8_ = local_f8._0_8_;
        auVar16._0_8_ = local_58;
        local_f8._8_8_ = local_58;
        local_138 = local_48;
        dStack_130 = local_68;
        iVar6 = 0;
        iVar9 = 0;
        do {
          while( true ) {
            iVar8 = iVar6 + 1;
            dVar21 = (double)iVar8;
            auVar11._0_8_ = auVar12._0_8_ * local_118 * (local_d8 + dVar21 + -2.0);
            auVar11._8_8_ = auVar12._8_8_ * local_118 * ((double)local_78._0_8_ + dVar21 + -2.0);
            auVar4._8_8_ = (double)local_128._8_8_ + dVar21 + -1.0;
            auVar4._0_8_ = (double)local_128._0_8_ + dVar21 + -1.0;
            auVar12 = divpd(auVar11,auVar4);
            auVar15._0_8_ = auVar16._0_8_ * local_e8;
            auVar15._8_8_ = auVar16._8_8_ * local_e8;
            auVar5._8_8_ = (double)(iVar10 + iVar8);
            auVar5._0_8_ = (double)(iVar10 + iVar8) + -1.0 + 1.5;
            auVar16 = divpd(auVar15,auVar5);
            local_48 = local_48 - auVar12._0_8_;
            local_68 = local_68 - auVar12._8_8_;
            dVar2 = dVar17 - auVar16._8_8_;
            dVar20 = auVar16._0_8_ * local_48 * local_98 + auVar16._8_8_ * local_68 + dVar20;
            if (iVar10 <= iVar9) break;
            auVar18._0_8_ = (double)local_148._0_8_ * (((double)local_128._0_8_ - dVar21) + 1.0);
            auVar18._8_8_ = (double)local_148._8_8_ * (((double)local_128._8_8_ - dVar21) + 1.0);
            auVar3._8_8_ = ((double)local_78._0_8_ - dVar21) * local_118;
            auVar3._0_8_ = (local_d8 - dVar21) * local_118;
            local_148 = divpd(auVar18,auVar3);
            local_138 = local_138 + local_148._0_8_;
            dStack_130 = dStack_130 + local_148._8_8_;
            dVar17 = (double)(iVar10 - iVar8) + 1.0;
            auVar19._0_8_ = (double)local_f8._0_8_ * dVar17;
            auVar19._8_8_ = (double)local_f8._8_8_ * (dVar17 + 0.5);
            auVar7._8_8_ = local_e8;
            auVar7._0_8_ = local_e8;
            local_f8 = divpd(auVar19,auVar7);
            dVar20 = local_f8._8_8_ * local_138 * local_98 + dStack_130 * local_f8._0_8_ + dVar20;
            dVar17 = dVar2 - local_f8._0_8_;
            if ((dVar17 <= 1e-12) || (bVar1 = 0x270d < iVar6, iVar6 = iVar8, iVar9 = iVar8, bVar1))
            goto LAB_0011146c;
          }
        } while ((1e-12 < dVar17 * (local_38 * 0.5 + 1.0) * 0.5 * local_68) &&
                (bVar1 = iVar6 < 0x270e, dVar17 = dVar2, iVar6 = iVar8, bVar1));
LAB_0011146c:
        local_c0 = dVar20 * 0.5 + local_c0;
        dVar20 = 1.0 - local_c0;
        if (local_88 < 0.0) {
          dVar20 = local_c0;
        }
        dVar17 = (double)(~-(ulong)(0.0 <= local_88) & (ulong)(1.0 - local_c0) |
                         (ulong)local_c0 & -(ulong)(0.0 <= local_88));
      }
      else {
        dVar20 = 1.0 - local_18;
        dVar17 = local_18;
      }
    }
    else {
      pVar22 = student_s2pq(t,df);
      dVar20 = pVar22.q;
      dVar17 = pVar22.p;
    }
  }
  pVar22.q = dVar20;
  pVar22.p = dVar17;
  return pVar22;
}

Assistant:

static pqpair tnonc_s2pq( double t , double df , double delta )
{
   int indx , k , i ;
   double x,del,tnd,ans,y,dels,a,b,c ;
   double pkf,pkb,qkf,qkb , pgamf,pgamb,qgamf,qgamb ;
   double pbetaf,pbetab,qbetaf,qbetab ;
   double ptermf,qtermf,ptermb,qtermb,term ;
   double rempois,delosq2,sum,cons,error ;

   pqpair pq={0.0,1.0} ;  /* will be return value */
   double ab1 ;

   /*-- stupid user? --*/

   if( df <= 0.0 ) return pq ;

   /*-- non-centrality = 0? --*/

   if( fabs(delta) < 1.e-8 ) return student_s2pq(t,df) ;

   /*-- start K's code here --*/

   if( t < 0.0 ){ x = -t ; del = -delta ; indx = 1 ; }  /* x will be */
   else         { x =  t ; del =  delta ; indx = 0 ; }  /* positive */

   ans = gaudf(-del) ;  /* prob that x <= 0 = Normal cdf */

   /*-- the nearly trivial case of x=0 --*/

   if( x == 0.0 ){ pq.p = ans; pq.q = 1.0-ans; return pq; }

   if( df == 1.0 ) df = 1.0000001 ;  /** df=1 is BAD **/

   y = x*x/(df+x*x) ;    /* between 0 and 1 */
   dels = 0.5*del*del ;  /* will be positive */
   k = (int)dels ;       /* 0, 1, 2, ... */
   a = k+0.5 ;           /* might be as small as 0.5 */
   c = k+1.0 ;
   b = 0.5*df ;          /* might be as small as 0.0 */

   pkf = exp(-dels+k*log(dels)-alng(k+1.0)) ;
   pkb = pkf ;
   qkf = exp(-dels+k*log(dels)-alng(k+1.0+0.5)) ;
   qkb = qkf ;

   pbetaf = betadf(y, a, b) ;
   pbetab = pbetaf ;
   qbetaf = betadf(y, c, b) ;
   qbetab = qbetaf ;

   ab1 = a+b-1.0 ;  /* might be as small as -0.5 */

   /*-- RWCox: if a+b-1 < 0, log(Gamma(a+b-1)) won't work;
               instead, use Gamma(a+b-1)=Gamma(a+b)/(a+b-1) --*/

   if( ab1 > 0.0 )
     pgamf = exp(alng(ab1)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y)) ;
   else
     pgamf = exp(alng(a+b)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y))/ab1 ;

   pgamb = pgamf*y*(ab1)/a ;

   /*-- we can't have c+b-1 < 0, so the above patchup isn't needed --*/

   qgamf = exp(alng(c+b-1.0)-alng(c)-alng(b)+(c-1.0)*log(y) + b*log(1.0-y)) ;
   qgamb = qgamf*y*(c+b-1.0)/c ;

   rempois = 1.0 - pkf ;
   delosq2 = del/1.4142135623731 ;
   sum = pkf*pbetaf+delosq2*qkf*qbetaf ;
   cons = 0.5*(1.0 + 0.5*fabs(delta)) ;
   i = 0 ;
L1:
   i = i + 1 ;
   pgamf = pgamf*y*(a+b+i-2.0)/(a+i-1.0) ;
   pbetaf = pbetaf - pgamf ;
   pkf = pkf*dels/(k+i) ;
   ptermf = pkf*pbetaf ;
   qgamf = qgamf*y*(c+b+i-2.0)/(c+i-1.0) ;
   qbetaf = qbetaf - qgamf ;
   qkf = qkf*dels/(k+i-1.0+1.5) ;
   qtermf = qkf*qbetaf ;
   term = ptermf + delosq2*qtermf  ;
   sum = sum + term ;
   error = rempois*cons*pbetaf ;
   rempois = rempois - pkf ;

   if( i > k ){
     if( error <= 1.e-12 || i >= 9999 ) goto L2 ;
     goto L1 ;
   } else {
     pgamb = pgamb*(a-i+1.0)/(y*(a+b-i)) ;
     pbetab = pbetab + pgamb ;
     pkb = (k-i+1.0)*pkb/dels ;
     ptermb = pkb*pbetab  ;
     qgamb = qgamb*(c-i+1.0)/(y*(c+b-i)) ;
     qbetab = qbetab + qgamb ;
     qkb = (k-i+1.0+0.5)*qkb/dels ;
     qtermb = qkb*qbetab  ;
     term =  ptermb + delosq2*qtermb ;
     sum = sum + term  ;
     rempois = rempois - pkb ;
     if (rempois <= 1.e-12 || i >= 9999) goto L2 ;
     goto L1 ;
   }
L2:
   tnd = 0.5*sum + ans ;

   /*-- return a pqpair, not just the cdf --*/

   if( indx ){ pq.p = 1.0-tnd; pq.q = tnd    ; }
   else      { pq.p = tnd    ; pq.q = 1.0-tnd; }
   return pq ;
}